

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::compute(dxt1_endpoint_optimizer *this,params *p,results *r)

{
  color_quad_u8 *pcVar1;
  params *ppVar2;
  
  pcVar1 = p->m_pPixels;
  if (pcVar1 != (color_quad_u8 *)0x0) {
    compute_internal(this,p,r);
    ppVar2 = this->m_pParams;
    if (((ppVar2->m_use_alpha_blocks == true) &&
        (ppVar2->m_use_transparent_indices_for_black == true)) &&
       (ppVar2->m_pixels_have_alpha == false)) {
      try_alpha_as_black_optimization(this);
    }
  }
  return pcVar1 != (color_quad_u8 *)0x0;
}

Assistant:

bool dxt1_endpoint_optimizer::compute(const params& p, results& r) {
  if (!p.m_pPixels)
    return false;
  compute_internal(p, r);
  if (m_pParams->m_use_alpha_blocks && m_pParams->m_use_transparent_indices_for_black && !m_pParams->m_pixels_have_alpha)
    return try_alpha_as_black_optimization();
  return true;
}